

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.cc
# Opt level: O0

void __thiscall
MutableS2ShapeIndex::ReserveSpace
          (MutableS2ShapeIndex *this,BatchDescriptor *batch,
          vector<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
          *all_edges)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  type this_00;
  size_type sVar5;
  const_reference p;
  ulong uVar6;
  double dVar7;
  double fraction;
  int face_1;
  double sample_ratio;
  double kMaxSemiWidth;
  S2Shape *local_98;
  S2Shape *shape;
  reference pRStack_88;
  int id;
  RemovedShape *removed;
  iterator __end2;
  iterator __begin2;
  vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>
  *__range2;
  int face_count [6];
  uint local_44;
  int actual_sample_size;
  int edge_id;
  int local_38;
  undefined4 local_34;
  int sample_interval;
  int kDesiredSampleSize;
  int face;
  int kMaxCheapEdges;
  size_t kMaxCheapBytes;
  vector<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
  *all_edges_local;
  BatchDescriptor *batch_local;
  MutableS2ShapeIndex *this_local;
  
  _face = 0x1e00000;
  kDesiredSampleSize = 0xd555;
  kMaxCheapBytes = (size_t)all_edges;
  all_edges_local =
       (vector<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_> *)
       batch;
  batch_local = (BatchDescriptor *)this;
  if (batch->num_edges < 0xd556) {
    for (sample_interval = 0; sample_interval < 6; sample_interval = sample_interval + 1) {
      std::vector<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>::
      reserve((vector<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
               *)(kMaxCheapBytes + (long)sample_interval * 0x18),
              (long)*(int *)((long)&(all_edges_local->
                                    super__Vector_base<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
                                    )._M_impl.super__Vector_impl_data._M_start + 4));
    }
  }
  else {
    local_34 = 10000;
    edge_id = 1;
    actual_sample_size = batch->num_edges / 10000;
    piVar4 = std::max<int>(&edge_id,&actual_sample_size);
    local_38 = *piVar4;
    local_44 = local_38 / 2;
    iVar2 = (int)(*(int *)((long)&(all_edges_local->
                                  super__Vector_base<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
                                  )._M_impl.super__Vector_impl_data._M_start + 4) + local_44) /
            local_38;
    memset(&__range2,0,0x18);
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->pending_removals_);
    if (bVar1) {
      this_00 = std::
                unique_ptr<std::vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>,_std::default_delete<std::vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>_>_>
                ::operator*(&this->pending_removals_);
      __end2 = std::
               vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>
               ::begin(this_00);
      removed = (RemovedShape *)
                std::
                vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>
                ::end(this_00);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<MutableS2ShapeIndex::RemovedShape_*,_std::vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>_>
                                         *)&removed), bVar1) {
        pRStack_88 = __gnu_cxx::
                     __normal_iterator<MutableS2ShapeIndex::RemovedShape_*,_std::vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>_>
                     ::operator*(&__end2);
        sVar5 = std::vector<S2Shape::Edge,_std::allocator<S2Shape::Edge>_>::size(&pRStack_88->edges)
        ;
        local_44 = local_44 + (int)sVar5;
        while (local_38 <= (int)local_44) {
          local_44 = local_44 - local_38;
          p = std::vector<S2Shape::Edge,_std::allocator<S2Shape::Edge>_>::operator[]
                        (&pRStack_88->edges,(long)(int)local_44);
          iVar3 = S2::GetFace(&p->v0);
          face_count[(long)iVar3 + -2] = face_count[(long)iVar3 + -2] + 1;
        }
        __gnu_cxx::
        __normal_iterator<MutableS2ShapeIndex::RemovedShape_*,_std::vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>_>
        ::operator++(&__end2);
      }
    }
    for (shape._4_4_ = this->pending_additions_begin_;
        shape._4_4_ <
        *(int *)&(all_edges_local->
                 super__Vector_base<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
                 )._M_impl.super__Vector_impl_data._M_start; shape._4_4_ = shape._4_4_ + 1) {
      local_98 = MutableS2ShapeIndex::shape(this,shape._4_4_);
      if (local_98 != (S2Shape *)0x0) {
        iVar3 = (*local_98->_vptr_S2Shape[2])();
        local_44 = iVar3 + local_44;
        while (local_38 <= (int)local_44) {
          local_44 = local_44 - local_38;
          (*local_98->_vptr_S2Shape[3])(&kMaxSemiWidth,local_98,(ulong)local_44);
          iVar3 = S2::GetFace((S2Point *)&kMaxSemiWidth);
          face_count[(long)iVar3 + -2] = face_count[(long)iVar3 + -2] + 1;
        }
      }
    }
    for (fraction._4_4_ = 0; fraction._4_4_ < 6; fraction._4_4_ = fraction._4_4_ + 1) {
      if (face_count[(long)fraction._4_4_ + -2] != 0) {
        dVar7 = ((1.0 / (double)iVar2) * (double)face_count[(long)fraction._4_4_ + -2] + 0.02) *
                (double)*(int *)((long)&(all_edges_local->
                                        super__Vector_base<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
                                        )._M_impl.super__Vector_impl_data._M_start + 4);
        uVar6 = (ulong)dVar7;
        std::vector<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>::
        reserve((vector<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
                 *)(kMaxCheapBytes + (long)fraction._4_4_ * 0x18),
                uVar6 | (long)(dVar7 - 9.223372036854776e+18) & (long)uVar6 >> 0x3f);
      }
    }
  }
  return;
}

Assistant:

void MutableS2ShapeIndex::ReserveSpace(const BatchDescriptor& batch,
                                       vector<FaceEdge> all_edges[6]) const {
  // If the number of edges is relatively small, then the fastest approach is
  // to simply reserve space on every face for the maximum possible number of
  // edges.  We use a different threshold for this calculation than for
  // deciding when to break updates into batches, because the cost/benefit
  // ratio is different.  (Here the only extra expense is that we need to
  // sample the edges to estimate how many edges per face there are.)
  const size_t kMaxCheapBytes = 30 << 20;  // 30 MB
  const int kMaxCheapEdges = kMaxCheapBytes / (6 * sizeof(FaceEdge));
  if (batch.num_edges <= kMaxCheapEdges) {
    for (int face = 0; face < 6; ++face) {
      all_edges[face].reserve(batch.num_edges);
    }
    return;
  }
  // Otherwise we estimate the number of edges on each face by taking a random
  // sample.  The goal is to come up with an estimate that is fast and
  // accurate for non-pathological geometry.  If our estimates happen to be
  // wrong, the vector will still grow automatically - the main side effects
  // are that memory usage will be larger (by up to a factor of 3), and
  // constructing the index will be about 10% slower.
  //
  // Given a desired sample size, we choose equally spaced edges from
  // throughout the entire data set.  We use a Bresenham-type algorithm to
  // choose the samples.
  const int kDesiredSampleSize = 10000;
  const int sample_interval = max(1, batch.num_edges / kDesiredSampleSize);

  // Initialize "edge_id" to be midway through the first sample interval.
  // Because samples are equally spaced the actual sample size may differ
  // slightly from the desired sample size.
  int edge_id = sample_interval / 2;
  const int actual_sample_size = (batch.num_edges + edge_id) / sample_interval;
  int face_count[6] = { 0, 0, 0, 0, 0, 0 };
  if (pending_removals_) {
    for (const RemovedShape& removed : *pending_removals_) {
      edge_id += removed.edges.size();
      while (edge_id >= sample_interval) {
        edge_id -= sample_interval;
        face_count[S2::GetFace(removed.edges[edge_id].v0)] += 1;
      }
    }
  }
  for (int id = pending_additions_begin_; id < batch.additions_end; ++id) {
    const S2Shape* shape = this->shape(id);
    if (shape == nullptr) continue;
    edge_id += shape->num_edges();
    while (edge_id >= sample_interval) {
      edge_id -= sample_interval;
      // For speed, we only count the face containing one endpoint of the
      // edge.  In general the edge could span all 6 faces (with padding), but
      // it's not worth the expense to compute this more accurately.
      face_count[S2::GetFace(shape->edge(edge_id).v0)] += 1;
    }
  }
  // Now given the raw face counts, compute a confidence interval such that we
  // will be unlikely to allocate too little space.  Computing accurate
  // binomial confidence intervals is expensive and not really necessary.
  // Instead we use a simple approximation:
  //  - For any face with at least 1 sample, we use at least a 4-sigma
  //    confidence interval.  (The chosen width is adequate for the worst case
  //    accuracy, which occurs when the face contains approximately 50% of the
  //    edges.)  Assuming that our sample is representative, the probability of
  //    reserving too little space is approximately 1 in 30,000.
  //  - For faces with no samples at all, we don't bother reserving space.
  //    It is quite likely that such faces are truly empty, so we save time
  //    and memory this way.  If the face does contain some edges, there will
  //    only be a few so it is fine to let the vector grow automatically.
  // On average, we reserve 2% extra space for each face that has geometry.

  // kMaxSemiWidth is the maximum semi-width over all probabilities p of a
  // 4-sigma binomial confidence interval with a sample size of 10,000.
  const double kMaxSemiWidth = 0.02;
  const double sample_ratio = 1.0 / actual_sample_size;
  for (int face = 0; face < 6; ++face) {
    if (face_count[face] == 0) continue;
    double fraction = sample_ratio * face_count[face] + kMaxSemiWidth;
    all_edges[face].reserve(fraction * batch.num_edges);
  }
}